

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

uint parse_hex4(char *str)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  cVar1 = *str;
  bVar2 = cVar1 - 0x30;
  if (9 < bVar2) {
    if ((byte)(cVar1 + 0xbfU) < 6) {
      bVar2 = cVar1 - 0x37;
    }
    else {
      if (5 < (byte)(cVar1 + 0x9fU)) {
        return 0;
      }
      bVar2 = cVar1 + 0xa9;
    }
  }
  cVar1 = str[1];
  bVar3 = cVar1 - 0x30;
  if (9 < bVar3) {
    if ((byte)(cVar1 + 0xbfU) < 6) {
      bVar3 = cVar1 - 0x37;
    }
    else {
      if (5 < (byte)(cVar1 + 0x9fU)) {
        return 0;
      }
      bVar3 = cVar1 + 0xa9;
    }
  }
  cVar1 = str[2];
  bVar4 = cVar1 - 0x30;
  if (9 < bVar4) {
    if ((byte)(cVar1 + 0xbfU) < 6) {
      bVar4 = cVar1 - 0x37;
    }
    else {
      if (5 < (byte)(cVar1 + 0x9fU)) {
        return 0;
      }
      bVar4 = cVar1 + 0xa9;
    }
  }
  cVar1 = str[3];
  bVar5 = cVar1 - 0x30;
  if (9 < bVar5) {
    if ((byte)(cVar1 + 0xbfU) < 6) {
      bVar5 = cVar1 - 0x37;
    }
    else {
      if (5 < (byte)(cVar1 + 0x9fU)) {
        return 0;
      }
      bVar5 = cVar1 + 0xa9;
    }
  }
  return (uint)bVar5 + ((uint)bVar4 + (uint)bVar3 * 0x10 + (uint)bVar2 * 0x100) * 0x10;
}

Assistant:

static unsigned parse_hex4(const char *str)
{
	unsigned h=0;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	h=h<<4;str++;
	if (*str>='0' && *str<='9') h+=(*str)-'0'; else if (*str>='A' && *str<='F') h+=10+(*str)-'A'; else if (*str>='a' && *str<='f') h+=10+(*str)-'a'; else return 0;
	return h;
}